

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O1

void __thiscall QPDFJob::copyAttachments(QPDFJob *this,QPDF *pdf)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  _Base_ptr *pp_Var2;
  element_type *peVar3;
  _func_int **pp_Var4;
  pointer pbVar5;
  bool bVar6;
  long *plVar7;
  _Base_ptr p_Var8;
  runtime_error *this_00;
  ulong *puVar9;
  size_type *psVar10;
  long *plVar11;
  iterator __end2;
  iterator __begin2;
  pointer pbVar12;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> other;
  QPDFObjectHandle new_fs_oh;
  string new_key;
  string message;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  duplicates;
  QPDFEmbeddedFileDocumentHelper other_efdh;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  other_attachments;
  QPDFEmbeddedFileDocumentHelper efdh;
  _Head_base<0UL,_QPDF_*,_false> local_1d8;
  string local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  QPDFFileSpecObjectHelper local_190;
  long *local_158;
  QPDFObjectHandle *local_150;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  _Any_data local_128;
  code *local_118;
  code *pcStack_110;
  QPDFObjectHandle local_108;
  undefined8 local_f8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_f0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_> *local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  p_Var1 = &local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_190,"/UseAttachments","");
  maybe_set_pagemode(pdf,(string *)&local_190);
  if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
    operator_delete(local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                    (ulong)((long)&(local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
                                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
  }
  local_150 = (QPDFObjectHandle *)pdf;
  QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
            ((QPDFEmbeddedFileDocumentHelper *)&local_50,pdf);
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  peVar3 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  plVar7 = *(long **)&(peVar3->attachments_to_copy).
                      super__List_base<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_>
                      ._M_impl._M_node.super__List_node_base;
  local_b0 = &peVar3->attachments_to_copy;
  if ((list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_> *)plVar7 !=
      local_b0) {
    do {
      local_128._M_unused._M_object = plVar7 + 2;
      local_128._8_8_ = 0;
      pcStack_110 = std::
                    _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2139:21)>
                    ::_M_invoke;
      local_118 = std::
                  _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2139:21)>
                  ::_M_manager;
      local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 local_128._M_unused._0_8_;
      doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_128);
      if (local_118 != (code *)0x0) {
        (*local_118)(&local_128,&local_128,__destroy_functor);
      }
      local_1d8._M_head_impl = (QPDF *)0x0;
      processFile(this,(unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&local_1d8,(char *)plVar7[2],
                  (char *)plVar7[6],false,false);
      QPDFEmbeddedFileDocumentHelper::QPDFEmbeddedFileDocumentHelper
                ((QPDFEmbeddedFileDocumentHelper *)&local_d0,local_1d8._M_head_impl);
      local_158 = plVar7;
      QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles_abi_cxx11_
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
                  *)&local_a0,(QPDFEmbeddedFileDocumentHelper *)&local_d0);
      if ((_Rb_tree_header *)local_a0._M_impl.super__Rb_tree_header._M_header._M_left !=
          &local_a0._M_impl.super__Rb_tree_header) {
        __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                (local_158 + 10);
        p_Var8 = local_a0._M_impl.super__Rb_tree_header._M_header._M_left;
        do {
          std::operator+(&local_1b0,__lhs,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         (p_Var8 + 1));
          QPDFEmbeddedFileDocumentHelper::getEmbeddedFile
                    ((QPDFEmbeddedFileDocumentHelper *)&local_190,&local_50);
          pp_Var4 = local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper;
          if (local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
                       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
          }
          if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)pp_Var4 ==
              (__shared_count<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            local_f8 = *(undefined8 *)(*(long *)(p_Var8 + 2) + 8);
            local_f0 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                        (*(long *)(p_Var8 + 2) + 0x10);
            if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_f0->_M_use_count = local_f0->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_f0->_M_use_count = local_f0->_M_use_count + 1;
              }
            }
            QPDF::copyForeignObject((QPDF *)&local_1d0,local_150);
            if (local_f0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_f0);
            }
            local_108.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)local_1d0._M_dataplus._M_p;
            local_108.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_1d0._M_string_length + 8) =
                     *(_Atomic_word *)(local_1d0._M_string_length + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_1d0._M_string_length + 8) =
                     *(_Atomic_word *)(local_1d0._M_string_length + 8) + 1;
              }
            }
            QPDFFileSpecObjectHelper::QPDFFileSpecObjectHelper(&local_190,&local_108);
            QPDFEmbeddedFileDocumentHelper::replaceEmbeddedFile
                      ((QPDFEmbeddedFileDocumentHelper *)&local_50,&local_1b0,&local_190);
            QPDFFileSpecObjectHelper::~QPDFFileSpecObjectHelper(&local_190);
            if (local_108.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_108.super_BaseHandle.obj.
                         super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                         _M_pi);
            }
            local_148._8_8_ = &local_1b0;
            pcStack_130 = std::
                          _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2153:29)>
                          ::_M_invoke;
            local_138 = std::
                        _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/libqpdf/QPDFJob.cc:2153:29)>
                        ::_M_manager;
            local_148._M_unused._M_object = p_Var8 + 1;
            doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                              *)&local_148);
            if (local_138 != (code *)0x0) {
              (*local_138)(&local_148,&local_148,__destroy_functor);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1d0._M_string_length)
              ;
            }
          }
          else {
            std::operator+(&local_70,"file: ",local_a8);
            p_Var1 = &local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
            plVar7 = (long *)std::__cxx11::string::append((char *)&local_70);
            psVar10 = (size_type *)(plVar7 + 2);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)*plVar7 ==
                (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)psVar10) {
              local_1d0.field_2._M_allocated_capacity = *psVar10;
              local_1d0.field_2._8_8_ = plVar7[3];
              local_1d0._M_dataplus._M_p = (pointer)&local_1d0.field_2;
            }
            else {
              local_1d0.field_2._M_allocated_capacity = *psVar10;
              local_1d0._M_dataplus._M_p = (pointer)*plVar7;
            }
            local_1d0._M_string_length = plVar7[1];
            *plVar7 = (long)psVar10;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            plVar7 = (long *)std::__cxx11::string::_M_append
                                       ((char *)&local_1d0,(ulong)local_1b0._M_dataplus._M_p);
            puVar9 = (ulong *)(plVar7 + 2);
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)*plVar7 ==
                (__shared_count<(__gnu_cxx::_Lock_policy)2> *)puVar9) {
              local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar9;
              local_190.super_QPDFObjectHelper.oh_.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)plVar7[3];
              local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)p_Var1;
            }
            else {
              local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*puVar9;
              local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper = (_func_int **)*plVar7;
            }
            local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)plVar7[1];
            *plVar7 = (long)puVar9;
            plVar7[1] = 0;
            *(undefined1 *)(plVar7 + 2) = 0;
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       &local_e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_190);
            if ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper != p_Var1) {
              operator_delete(local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper,
                              (ulong)((long)&(local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
                                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi)->_vptr__Sp_counted_base + 1));
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
              operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_70._M_dataplus._M_p != &local_70.field_2) {
              operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
            }
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
            operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
          }
          p_Var8 = (_Base_ptr)std::_Rb_tree_increment(p_Var8);
        } while ((_Rb_tree_header *)p_Var8 != &local_a0._M_impl.super__Rb_tree_header);
      }
      bVar6 = QPDF::anyWarnings(local_1d8._M_head_impl);
      plVar7 = local_158;
      if (bVar6) {
        ((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        warnings = true;
      }
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
      ::~_Rb_tree(&local_a0);
      QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
                ((QPDFEmbeddedFileDocumentHelper *)&local_d0);
      std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr
                ((unique_ptr<QPDF,_std::default_delete<QPDF>_> *)&local_1d8);
      plVar7 = (long *)*plVar7;
    } while ((list<QPDFJob::CopyAttachmentFrom,_std::allocator<QPDFJob::CopyAttachmentFrom>_> *)
             plVar7 != local_b0);
  }
  pbVar5 = local_e8.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_e8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_e8);
    QPDFEmbeddedFileDocumentHelper::~QPDFEmbeddedFileDocumentHelper
              ((QPDFEmbeddedFileDocumentHelper *)&local_50);
    return;
  }
  local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
       super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi &
       0xffffffffffffff00;
  pbVar12 = local_e8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  local_190.super_QPDFObjectHelper._vptr_QPDFObjectHelper =
       (_func_int **)
       &local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
  do {
    if (local_190.super_QPDFObjectHelper.super_BaseHandle.obj.
        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr != (element_type *)0x0) {
      std::__cxx11::string::append((char *)&local_190);
    }
    std::__cxx11::string::_M_append((char *)&local_190,(ulong)(pbVar12->_M_dataplus)._M_p);
    pbVar12 = pbVar12 + 1;
  } while (pbVar12 != pbVar5);
  QPDF::getFilename_abi_cxx11_(&local_1d0,(QPDF *)local_150);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_1d0);
  local_1b0._M_dataplus._M_p = (pointer)*plVar7;
  psVar10 = (size_type *)(plVar7 + 2);
  if ((size_type *)local_1b0._M_dataplus._M_p == psVar10) {
    local_1b0.field_2._M_allocated_capacity = *psVar10;
    local_1b0.field_2._8_8_ = plVar7[3];
    local_1b0._M_dataplus._M_p = (pointer)&local_1b0.field_2;
  }
  else {
    local_1b0.field_2._M_allocated_capacity = *psVar10;
  }
  local_1b0._M_string_length = plVar7[1];
  *plVar7 = (long)psVar10;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::operator+(&local_d0,&local_1b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_190);
  plVar7 = (long *)std::__cxx11::string::append((char *)&local_d0);
  pp_Var2 = &local_a0._M_impl.super__Rb_tree_header._M_header._M_parent;
  local_a0._M_impl._0_8_ = *plVar7;
  plVar11 = plVar7 + 2;
  if ((long *)local_a0._M_impl._0_8_ == plVar11) {
    local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar11;
    local_a0._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)plVar7[3];
    local_a0._M_impl._0_8_ = pp_Var2;
  }
  else {
    local_a0._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)*plVar11;
  }
  local_a0._M_impl.super__Rb_tree_header._M_header._0_8_ = plVar7[1];
  *plVar7 = (long)plVar11;
  plVar7[1] = 0;
  *(undefined1 *)(plVar7 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_190,(string *)&local_a0);
  if ((_Base_ptr *)local_a0._M_impl._0_8_ != pp_Var2) {
    operator_delete((void *)local_a0._M_impl._0_8_,
                    (ulong)((long)&(local_a0._M_impl.super__Rb_tree_header._M_header._M_parent)->
                                   _M_color + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p,local_1b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p,local_1d0.field_2._M_allocated_capacity + 1);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,(string *)&local_190);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
QPDFJob::copyAttachments(QPDF& pdf)
{
    maybe_set_pagemode(pdf, "/UseAttachments");
    QPDFEmbeddedFileDocumentHelper efdh(pdf);
    std::vector<std::string> duplicates;
    for (auto const& to_copy: m->attachments_to_copy) {
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": copying attachments from " << to_copy.path << "\n";
        });
        std::unique_ptr<QPDF> other;
        processFile(other, to_copy.path.c_str(), to_copy.password.c_str(), false, false);
        QPDFEmbeddedFileDocumentHelper other_efdh(*other);
        auto other_attachments = other_efdh.getEmbeddedFiles();
        for (auto const& iter: other_attachments) {
            std::string new_key = to_copy.prefix + iter.first;
            if (efdh.getEmbeddedFile(new_key)) {
                duplicates.push_back("file: " + to_copy.path + ", key: " + new_key);
            } else {
                auto new_fs_oh = pdf.copyForeignObject(iter.second->getObjectHandle());
                efdh.replaceEmbeddedFile(new_key, QPDFFileSpecObjectHelper(new_fs_oh));
                doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                    v << "  " << iter.first << " -> " << new_key << "\n";
                });
            }
        }

        if (other->anyWarnings()) {
            m->warnings = true;
        }
    }

    if (!duplicates.empty()) {
        std::string message;
        for (auto const& i: duplicates) {
            if (!message.empty()) {
                message += "; ";
            }
            message += i;
        }
        message = pdf.getFilename() +
            " already has attachments with keys that conflict with attachments from other files: " +
            message +
            ". Use --prefix with --copy-attachments-from or manually copy individual attachments.";
        throw std::runtime_error(message);
    }
}